

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::type_name(string_t *__return_storage_ptr__,
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
           *this)

{
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((this->m_type).data & 0xf) {
  case 0:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_9);
    break;
  case 1:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"object",&local_a);
    break;
  case 2:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"array",&local_b);
    break;
  case 3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"string",&local_c);
    break;
  case 4:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"boolean",&local_d);
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"number",&local_f);
    break;
  case 8:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"discarded",&local_e);
  }
  return __return_storage_ptr__;
}

Assistant:

string_t type_name() const noexcept
        {
            switch (m_type)
            {
                case value_t::null:
                    return "null";
                case value_t::object:
                    return "object";
                case value_t::array:
                    return "array";
                case value_t::string:
                    return "string";
                case value_t::boolean:
                    return "boolean";
                case value_t::discarded:
                    return "discarded";
                default:
                    return "number";
            }
        }